

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::localize_global_variables(CompilerMSL *this)

{
  SmallVector<unsigned_int,_8UL> *this_00;
  VariableID id;
  bool bVar1;
  SPIRFunction *this_01;
  uint *puVar2;
  SPIRVariable *var;
  uint *itr;
  
  this_01 = Compiler::get<spirv_cross::SPIRFunction>
                      ((Compiler *)this,
                       (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  this_00 = &(this->super_CompilerGLSL).super_Compiler.global_variables;
  puVar2 = (this->super_CompilerGLSL).super_Compiler.global_variables.super_VectorView<unsigned_int>
           .ptr;
  itr = puVar2;
  while (itr != puVar2 + (this->super_CompilerGLSL).super_Compiler.global_variables.
                         super_VectorView<unsigned_int>.buffer_size) {
    id.id = *itr;
    var = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,id.id);
    if ((var->storage | StorageClassUniform) == StorageClassPrivate) {
      bVar1 = CompilerGLSL::variable_is_lut(&this->super_CompilerGLSL,var);
      if (!bVar1) {
        SPIRFunction::add_local_variable(this_01,id);
      }
      itr = SmallVector<unsigned_int,_8UL>::erase(this_00,itr);
    }
    else {
      itr = itr + 1;
    }
    puVar2 = (this_00->super_VectorView<unsigned_int>).ptr;
  }
  return;
}

Assistant:

void CompilerMSL::localize_global_variables()
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	auto iter = global_variables.begin();
	while (iter != global_variables.end())
	{
		uint32_t v_id = *iter;
		auto &var = get<SPIRVariable>(v_id);
		if (var.storage == StorageClassPrivate || var.storage == StorageClassWorkgroup)
		{
			if (!variable_is_lut(var))
				entry_func.add_local_variable(v_id);
			iter = global_variables.erase(iter);
		}
		else
			iter++;
	}
}